

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M2L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer ppVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar55;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  ostream *poVar56;
  long lVar57;
  long lVar58;
  pointer pMVar59;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar60;
  ulong uVar61;
  byte bVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dStack_e10;
  double dStack_db0;
  double dStack_da0;
  double dStack_d90;
  double dStack_d80;
  double dStack_d70;
  double dStack_d30;
  double dStack_c50;
  double dStack_c40;
  double dStack_c30;
  double dStack_c20;
  double dStack_c10;
  double dStack_bf0;
  double dStack_b90;
  double dStack_b80;
  double dStack_b70;
  double dStack_b40;
  double dStack_b30;
  double dStack_b20;
  double dStack_b10;
  double local_ac0;
  Scalar local_ab8;
  Scalar local_ab0;
  Scalar local_aa8;
  double local_aa0;
  double tz;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_4,_4,_0,_4,_4> Tw;
  Matrix<double,_3,_1,_0,_3,_1> t;
  vector<double,_std::allocator<double>_> realRoots;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines3;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines2;
  double dStack_970;
  double dStack_960;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  trans;
  Type local_940;
  Matrix<double,_6,_1,_0,_6,_1> lU4;
  Matrix<double,_6,_1,_0,_6,_1> lU3;
  double dStack_880;
  double dStack_870;
  double dStack_7d0;
  double dStack_7c0;
  Matrix<double,_6,_1,_0,_6,_1> lU6;
  Matrix<double,_3,_3,_0,_3,_3> R;
  Matrix<double,_4,_4,_0,_4,_4> sol;
  Matrix<double,_6,_1,_0,_6,_1> lU5;
  Matrix<double,_6,_1,_0,_6,_1> lU2;
  Matrix<double,_6,_1,_0,_6,_1> lU1;
  Matrix<double,_3,_1,_0,_3,_1> local_5b8;
  Matrix<double,_3,_1,_0,_3,_1> local_5a0;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  Matrix<double,_6,_1,_0,_6,_1> local_338;
  Matrix<double,_6,_1,_0,_6,_1> local_308;
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_1b8;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_138;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_b8;
  
  bVar62 = 0;
  ppVar1 = (lCPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar1) &&
     ((ulong)((long)(lPair->
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(lPair->
                   super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81)) {
    poVar56 = std::operator<<((ostream *)&std::cerr,
                              "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                             );
    std::endl<char,std::char_traits<char>>(poVar56);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[1];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[3];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[1];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[2];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[3];
  getPluckerCoord<double>(&lines1,&local_b8);
  ppVar1 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        8);
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x10);
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x18);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&lines2,&local_138);
  ppVar1 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        8);
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x10);
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x18);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&lines3,&local_1b8);
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       ((lines1.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       ((lines1.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       ((lines1.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       ((lines1.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       ((lines1.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       ((lines1.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  getPredefinedTransformations1M1Q<double>(&trans,&local_308,&local_338);
  lVar58 = 0x10;
  pMVar59 = trans.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar60 = &TU1;
  for (lVar57 = lVar58; lVar57 != 0; lVar57 = lVar57 + -1) {
    (pMVar60->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar59->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar59 = (pointer)((long)pMVar59 + ((ulong)bVar62 * -2 + 1) * 8);
    pMVar60 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar60 + ((ulong)bVar62 * -2 + 1) * 8);
  }
  pMVar59 = trans.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pMVar60 = &TU2;
  for (; lVar58 != 0; lVar58 = lVar58 + -1) {
    (pMVar60->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar59->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar59 = (pointer)((long)pMVar59 + ((ulong)bVar62 * -2 + 1) * 8);
    pMVar60 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar60 + ((ulong)bVar62 * -2 + 1) * 8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&TUL1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
              *)&TUL2);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&TUL2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
              *)&Tw);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tw,&TU1,3,3);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>((Type *)&sol,&TUL1,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&sol,
             (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Tw);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tw,&TU1,3,3);
  Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&sol,&TUL1,3,3,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&sol,
             (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Tw);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>((Type *)&R,&TU1,3,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_5a0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)&R);
  getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&sol,&local_5a0);
  lU2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)&sol;
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>(&local_940,&TU1,3,3);
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
             *)&Tw,(Lhs *)&lU2,&local_940);
  Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&lU1,&TUL1,3,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&lU1,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&Tw);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tw,&TU2,3,3);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>((Type *)&sol,&TUL2,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&sol,
             (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Tw);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tw,&TU2,3,3);
  Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&sol,&TUL2,3,3,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&sol,
             (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Tw);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>((Type *)&R,&TU2,3,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_5b8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)&R);
  getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&sol,&local_5b8);
  lU2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)&sol;
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>(&local_940,&TU2,3,3);
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
             *)&Tw,(Lhs *)&lU2,&local_940);
  Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&lU1,&TUL2,3,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&lU1,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&Tw);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)lines1.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&TUL1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU1,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&Tw);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)(lines1.
                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&TUL2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU2,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&Tw);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)lines2.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&TUL1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU3,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&Tw);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)(lines2.
                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&TUL2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU4,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&Tw);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)lines3.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&TUL1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU5,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&Tw);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)(lines3.
                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
  Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&TUL2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU6,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&Tw);
  dVar12 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] + lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
  dVar13 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] + lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4];
  dVar70 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4];
  dVar41 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[5];
  auVar22._8_4_ = SUB84(dVar41,0);
  auVar22._0_8_ = dVar70;
  auVar22._12_4_ = (int)((ulong)dVar41 >> 0x20);
  dVar41 = -(lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[1]);
  dVar87 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * 2.0;
  auVar23._8_4_ =
       SUB84(lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] * dVar12,0);
  auVar23._0_8_ = dVar41;
  auVar23._12_4_ =
       (int)((ulong)(lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] * dVar12) >> 0x20);
  dVar14 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5] * -2.0;
  dVar73 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * 4.0;
  dVar96 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * 4.0;
  auVar44._8_4_ = SUB84(dVar14,0);
  auVar44._0_8_ =
       lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  auVar44._12_4_ = (int)((ulong)dVar14 >> 0x20);
  auVar24._8_4_ =
       SUB84(dVar14 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0],0);
  auVar24._0_8_ =
       -dVar96 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4];
  auVar24._12_4_ =
       (int)((ulong)(dVar14 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0]) >> 0x20);
  dVar89 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] * -2.0 *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
  dVar14 = dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1];
  uVar2 = (ulong)DAT_003ba0b0;
  dVar37 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] * dVar87;
  dVar42 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] * dVar13;
  auVar25._8_4_ = SUB84(dVar42,0);
  auVar25._0_8_ = dVar37;
  auVar25._12_4_ = (int)((ulong)dVar42 >> 0x20);
  uVar61 = DAT_003ba0b0._8_8_;
  dVar76 = dVar87 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1];
  dVar42 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3] * dVar96 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0];
  auVar3._8_4_ = SUB84(lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3] * dVar76,0);
  auVar3._0_8_ = dVar42;
  auVar3._12_4_ =
       (int)((ulong)(lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[3] * dVar76) >> 0x20);
  auVar4._8_4_ = SUB84(lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1],0);
  auVar4._0_8_ = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
  auVar4._12_4_ =
       (int)((ulong)lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1] >> 0x20);
  dVar50 = (double)((ulong)(dVar96 * lU5.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1]) ^ uVar2) *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar54 = dVar76 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1];
  auVar45._8_4_ = SUB84(dVar54,0);
  auVar45._0_8_ = dVar50;
  auVar45._12_4_ = (int)((ulong)dVar54 >> 0x20);
  dVar15 = lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
  dVar54 = lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] * (double)((ulong)dVar54 ^ uVar61);
  auVar5._8_4_ = SUB84(dVar54,0);
  auVar5._0_8_ = dVar15;
  auVar5._12_4_ = (int)((ulong)dVar54 >> 0x20);
  dVar88 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar51 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] * dVar87 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar79 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * (double)((ulong)lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[4] ^ uVar2) *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
  dVar43 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] * dVar76;
  uVar63 = (undefined4)((ulong)dVar43 >> 0x20);
  auVar26._8_4_ = SUB84(dVar43,0);
  auVar26._0_8_ = dVar79;
  auVar26._12_4_ = uVar63;
  auVar27._8_4_ = SUB84(dVar43,0);
  auVar27._0_8_ = dVar79;
  auVar27._12_4_ = uVar63;
  auVar28._8_4_ = SUB84(dVar51,0);
  auVar28._0_8_ = dVar43;
  auVar28._12_4_ = (int)((ulong)dVar51 >> 0x20);
  dVar54 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5];
  dVar21 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] * -2.0 *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
  uVar63 = SUB84(dVar21,0);
  uVar64 = (undefined4)((ulong)dVar21 >> 0x20);
  auVar6._8_4_ = uVar63;
  auVar6._0_8_ = dVar54;
  auVar6._12_4_ = uVar64;
  dVar52 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
  dVar21 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5] * dVar87;
  auVar46._8_4_ = SUB84(dVar21,0);
  auVar46._0_8_ = dVar52;
  auVar46._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dStack_d70 = auVar44._8_8_;
  auVar7._8_4_ = SUB84(lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1] * dStack_d70,0);
  auVar7._0_8_ = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5];
  auVar7._12_4_ =
       (int)((ulong)(lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[1] * dStack_d70) >> 0x20);
  dVar21 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3] + lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3];
  dVar84 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar13 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dVar38 = (double)((ulong)lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[0] ^ uVar2);
  dVar83 = dVar87 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar75 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * dVar21 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dVar53 = (double)((ulong)dVar75 ^ uVar2);
  auVar47._8_4_ = SUB84(dVar83,0);
  auVar47._0_8_ = dVar53;
  auVar47._12_4_ = (int)((ulong)dVar83 >> 0x20);
  dVar95 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] * dVar13;
  dVar71 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] * dVar13;
  dStack_d30 = auVar4._8_8_;
  dVar82 = dVar87 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[2] * dStack_d30;
  dStack_d30 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] * dVar21 * dStack_d30;
  dVar16 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar38 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3];
  dStack_970 = auVar3._8_8_;
  auVar29._8_4_ = (int)((ulong)dStack_970 ^ uVar61);
  auVar29._0_8_ = dVar16;
  auVar29._12_4_ = (int)(((ulong)dStack_970 ^ uVar61) >> 0x20);
  dVar17 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  uVar61 = (ulong)dVar84 ^ uVar61;
  auVar30._8_4_ = (int)uVar61;
  auVar30._0_8_ = dVar17;
  auVar30._12_4_ = (int)(uVar61 >> 0x20);
  dVar18 = (double)((ulong)dVar73 ^ uVar2) *
           lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dStack_d80 = auVar23._8_8_;
  dVar41 = dVar41 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[4];
  auVar48._8_4_ =
       SUB84(dStack_d80 *
             lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0],0);
  auVar48._0_8_ = dVar41;
  auVar48._12_4_ =
       (int)((ulong)(dStack_d80 *
                    lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0]) >> 0x20);
  dVar72 = dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[4] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dVar66 = dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0];
  dVar19 = dVar87 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0];
  dVar77 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar21 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dVar80 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * dVar21 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar85 = dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[4] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar74 = dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0];
  dVar76 = dVar76 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0];
  dVar78 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3] * dVar66;
  dVar81 = lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[3];
  dVar97 = dVar66 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0] *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3];
  dVar20 = dVar12 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
  dVar91 = dVar14 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3];
  dVar75 = dVar75 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0];
  dVar67 = dVar66 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1] *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4];
  dVar39 = dVar66 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[4] *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dVar94 = dVar14 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0] *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4];
  dVar86 = dVar14 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1] *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3];
  auVar31._8_4_ = SUB84(dVar74,0);
  auVar31._0_8_ = dVar91;
  auVar31._12_4_ = (int)((ulong)dVar74 >> 0x20);
  auVar32._8_4_ =
       SUB84(lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * dVar76,0);
  auVar32._0_8_ =
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] *
       dVar74;
  auVar32._12_4_ =
       (int)((ulong)(lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[3] * dVar76) >> 0x20);
  dVar40 = lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar73 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[3] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
  dVar68 = lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3] * dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1];
  auVar33._8_4_ = SUB84(dVar68,0);
  auVar33._0_8_ = dVar40;
  auVar33._12_4_ = (int)((ulong)dVar68 >> 0x20);
  dStack_c50 = auVar29._8_8_;
  dVar68 = dVar87 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dVar69 = -dVar68;
  uVar65 = (undefined4)
           ((ulong)lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] >> 0x20);
  auVar8._8_4_ = SUB84(lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0],0);
  auVar8._0_8_ = lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4];
  auVar8._12_4_ = uVar65;
  auVar34._8_4_ =
       SUB84(lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0],0);
  auVar34._0_8_ =
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  auVar34._12_4_ = uVar65;
  dStack_c30 = auVar30._8_8_;
  dStack_d80 = auVar48._8_8_;
  dStack_960 = auVar22._8_8_;
  dStack_bf0 = auVar5._8_8_;
  dStack_b80 = auVar26._8_8_;
  dVar70 = dVar79 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0] +
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar70 +
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * dVar41 +
           dVar17 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[4] +
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] + lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] * dVar38 *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] * dVar38 *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] +
                 (double)((ulong)lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] ^ uVar2) *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] +
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] +
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] +
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] * dVar38 *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] +
                 dVar16 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] +
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
                 -(lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] *
                  lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0]) *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] + dVar15;
  dVar90 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  auVar35._8_4_ =
       SUB84(lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2],0);
  auVar35._0_8_ =
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  auVar35._12_4_ =
       (int)((ulong)lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[2] >> 0x20);
  dVar16 = dVar96 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  auVar49._8_4_ = SUB84(dVar95,0);
  auVar49._0_8_ = dVar85;
  auVar49._12_4_ = (int)((ulong)-dVar95 >> 0x20);
  dStack_b10 = auVar45._8_8_;
  auVar36._8_4_ = uVar63;
  auVar36._0_8_ = dVar16;
  auVar36._12_4_ = uVar64;
  dVar92 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dStack_d90 = auVar25._8_8_;
  dStack_b20 = auVar24._8_8_;
  dStack_e10 = auVar7._8_8_;
  dVar93 = lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [2];
  dVar41 = dVar80 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1];
  auVar9._8_4_ = SUB84(dVar41,0);
  auVar9._0_8_ = dVar77 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0];
  auVar9._12_4_ = (int)((ulong)dVar41 >> 0x20);
  dStack_b70 = auVar28._8_8_;
  auVar10._8_4_ =
       SUB84(dStack_b70 *
             lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1],0);
  auVar10._0_8_ =
       dVar43 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
  auVar10._12_4_ =
       (int)((ulong)(dStack_b70 *
                    lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1]) >> 0x20);
  dVar41 = dStack_d90 *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
  dVar15 = dStack_e10 *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [2] * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
  auVar11._8_4_ = SUB84(dVar15,0);
  auVar11._0_8_ = dVar41;
  auVar11._12_4_ = (int)((ulong)dVar15 >> 0x20);
  dStack_b90 = auVar46._8_8_;
  dStack_c10 = auVar35._8_8_;
  dVar79 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [2] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5];
  dVar17 = lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5] * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [2];
  factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       dVar93 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] +
       -dVar17 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
       dVar52 + -dVar79 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1] +
                -dVar90 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[2] +
                -dVar92 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[5] +
                dVar54 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] +
                dVar88 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[5] + dVar70;
  factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       dStack_e10 *
       lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
       dVar89 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
       dStack_c10 * dStack_b90 +
       dVar82 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5] +
       dStack_b20 *
       lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       dStack_d90 *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
       auVar6._8_8_ *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       (double)((ulong)dVar51 ^ uVar2) *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
       dStack_b80 *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
       dStack_960 +
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
       dStack_d80 +
       dStack_c30 *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       dVar95 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] +
       dVar71 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
       dStack_d30 *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       dVar77 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
       -dVar80 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
       dVar37 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] +
       (double)((ulong)dVar83 ^ uVar2) *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       dVar69 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
       dStack_c50 *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       dVar76 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] +
       dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
       dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
       ((lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
         * -dVar74 +
        (((dVar81 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1] +
          dVar14 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[4] *
          lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
          + ((((((dVar78 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[0] - dVar97) - dVar20) + dVar75 + dVar67) - dVar39
              ) - dVar94) - dVar86) +
            dVar91 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[1]) -
         dVar72 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1]) -
        dVar85 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0])) -
       dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]) +
       dStack_bf0;
  dStack_c40 = auVar8._8_8_;
  dStack_b40 = auVar31._8_8_;
  dStack_880 = auVar33._8_8_;
  dVar83 = -(dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]);
  dStack_870 = auVar32._8_8_;
  dStack_7d0 = auVar47._8_8_;
  dStack_c20 = auVar34._8_8_;
  dStack_da0 = auVar9._8_8_;
  dStack_db0 = auVar49._8_8_;
  dStack_7c0 = auVar27._8_8_;
  dStack_b70 = auVar10._8_8_;
  dStack_b30 = auVar36._8_8_;
  dVar15 = dStack_d90 *
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
  dStack_d90 = auVar11._8_8_;
  factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       dVar41 + lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
                lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * 4.0 *
                lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] *
                lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
                lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * -dVar95 +
                lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * -4.0 *
                lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] *
                lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] *
                lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
                lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
                -dVar96 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[4] *
                lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
                ((dVar16 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[1] +
                 dVar43 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] +
                 dVar96 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] * -dVar76 +
                 dVar83 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1] +
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 dVar96 * lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] +
                 dVar85 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1] +
                 dVar18 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[4] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
                 dVar14 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] +
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] * 4.0 *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] +
                 dVar77 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] +
                 lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] * -4.0 *
                 lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] *
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] +
                 dVar53 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[1] +
                 dVar69 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] +
                 dVar42 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] +
                 ((lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[4] * (double)((ulong)dVar73 ^ uVar2) *
                   lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] *
                   lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] +
                  dVar81 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[0] +
                  dVar40 + lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[0] * dVar91 +
                           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[3] *
                           dVar18 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                    .m_storage.m_data.array[0] +
                           (double)((ulong)(dVar73 * lU5.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0]) ^ uVar2) *
                           lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[4] *
                           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[0] +
                           ((dVar73 * lU5.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[0] *
                             lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] *
                             lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] +
                            dVar66 * lU4.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] *
                            lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[3]) -
                           dVar78 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                    .m_storage.m_data.array[1])) -
                 lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] * dVar74) +
                 dVar50 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[3]) -
                dVar37 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1]);
  factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       dStack_d90 +
       dVar89 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
       dStack_b90 *
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
       dVar82 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5] +
       lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
       dStack_b20 *
       lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
       ((dStack_b30 * dStack_c20 +
        dStack_b70 +
        -dStack_7c0 *
        lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
        lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
        dStack_960 +
        dStack_d80 *
        lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] +
        dStack_c40 * dVar84 +
        dStack_db0 * dStack_c20 +
        -dVar71 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
        -dStack_d30 * dStack_c40 +
        -dVar77 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
        dStack_da0 +
        (double)((ulong)dVar37 ^ uVar2) *
        lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
        dStack_7d0 * dStack_c20 +
        dVar68 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] +
        dStack_970 *
        lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
        ((dVar83 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] +
         -(dVar19 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3]) *
         lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
         + dStack_880 +
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] * dStack_b40 +
           lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * dVar85 +
           dVar72 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1] +
           (((double)((ulong)(dVar14 * lU4.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[4]) ^ uVar2) * dStack_c40 +
            (((((dVar97 + (double)((ulong)dVar78 ^ uVar2) *
                          lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0] + dVar20) - dVar75) - dVar67) + dVar39 + dVar94 + dVar86)
            - dVar91 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1])) -
           dVar81 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1])) - dStack_870) +
        dStack_b10 *
        lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4])
       - dVar15);
  factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       (lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] *
        dVar17 + ((dVar79 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[1] +
                  dVar90 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[2] +
                  dVar92 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[5] +
                  ((dVar70 - dVar88 * lU6.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[5]) -
                  dVar54 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[2])) -
                 dVar52 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[0])) -
       dVar93 * lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
  o4_roots<double>(&realRoots,&factors);
  for (uVar61 = 0;
      uVar61 < (ulong)((long)realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar61 = uVar61 + 1) {
    dVar41 = realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar61];
    tz = -(-dVar13 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[0] * dVar41 +
          dVar21 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[1] * dVar41 +
          -dVar87 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3] * dVar41 +
          dVar12 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[4] * dVar41 +
          lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
          * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [2] * dVar41 * dVar41 +
          lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
          * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [5] * dVar41 * dVar41 +
          (double)((ulong)lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array[4] ^ uVar2) *
          lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
          * dVar41 * dVar41 +
          lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
          * -lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * dVar41 * dVar41 +
          dVar41 * -(lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[3] *
                    lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0]) * dVar41 +
          dVar38 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[3] * dVar41 * dVar41 +
          lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
          * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [1] + lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] *
                  lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] +
                  lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] *
                  lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] +
                  lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] *
                  lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] +
          lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
          * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [5] + lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] *
                  lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2]) /
         (dVar87 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[1] * dVar41 +
         dVar12 * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * dVar41 +
         -lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
         * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0] * dVar41 * dVar41 +
         lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1] * dVar41 * dVar41 +
         (lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
          * lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [0] - lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] *
                  lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1]));
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         dVar41 * -2.0;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&R;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0;
    dVar14 = 1.0 - dVar41 * dVar41;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         4.94065645841247e-324;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         4.94065645841247e-324;
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         dVar14;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Tw,
                         (Scalar *)&sol);
    local_940.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)0x0;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar55,(Scalar *)&local_940);
    t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         dVar41 + dVar41;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar55,(Scalar *)&t);
    local_aa0 = dVar14;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar55,&local_aa0);
    local_aa8 = 0.0;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar55,&local_aa8);
    local_ab0 = 0.0;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar55,&local_ab0);
    local_ab8 = 0.0;
    pCVar55 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar55,&local_ab8);
    dVar41 = dVar41 * dVar41 + 1.0;
    local_ac0 = dVar41;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar55,&local_ac0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Tw);
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         1.0 / dVar41;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&Tw,(double *)&sol,(StorageBaseType *)&R);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
              (&R,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                   *)&Tw);
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&t;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         4.94065645841247e-324;
    t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    Tw.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         4.94065645841247e-324;
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.0
    ;
    this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Tw,(Scalar *)&sol)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this,&tz);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Tw);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&Tw,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&sol);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_940,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                *)&Tw,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_940,&R);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_940,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                *)&Tw,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_940,&t);
    local_940.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&TU2;
    local_940.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)&TU1;
    local_940.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&Tw;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
              (&sol,(Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
                     *)&local_940);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&sol);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&realRoots.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::~_Vector_base(&trans.
                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&lines3.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&lines2.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&lines1.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}